

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
* libtorrent::anon_unknown_62::read_nodes
            (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
             *__return_storage_ptr__,stack_allocator *alloc,int v4_num_nodes,
            allocation_slot v4_nodes_idx,int v6_num_nodes,allocation_slot v6_nodes_idx)

{
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **ppcVar1;
  char **extraout_RDX_02;
  sha1_hash ih;
  char *v6_ptr;
  char *v4_ptr;
  digest32<160L> local_a8;
  uint *local_90;
  uint *local_88;
  allocation_slot local_7c;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_78;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *local_60;
  stack_allocator *local_58;
  basic_endpoint<boost::asio::ip::udp> local_4c;
  
  local_78.
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ::reserve(&local_78,(long)(v6_num_nodes + v4_num_nodes));
  local_7c.m_idx = v6_nodes_idx.m_idx;
  local_58 = alloc;
  local_88 = (uint *)aux::stack_allocator::ptr(alloc,v4_nodes_idx);
  local_60 = __return_storage_ptr__;
  if (0 < v4_num_nodes) {
    ppcVar1 = extraout_RDX;
    do {
      local_a8.m_number._M_elems._0_8_ = *(undefined8 *)local_88;
      local_a8.m_number._M_elems._8_8_ = *(undefined8 *)(local_88 + 2);
      local_a8.m_number._M_elems[4] = local_88[4];
      local_88 = local_88 + 5;
      detail::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
                (&local_4c,(detail *)&local_88,ppcVar1);
      std::
      vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
      ::
      emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                  *)&local_78,&local_a8,&local_4c);
      v4_num_nodes = v4_num_nodes + -1;
      ppcVar1 = extraout_RDX_00;
    } while (v4_num_nodes != 0);
  }
  local_90 = (uint *)aux::stack_allocator::ptr(local_58,local_7c);
  if (0 < v6_num_nodes) {
    ppcVar1 = extraout_RDX_01;
    do {
      local_a8.m_number._M_elems._0_8_ = *(undefined8 *)local_90;
      local_a8.m_number._M_elems._8_8_ = *(undefined8 *)(local_90 + 2);
      local_a8.m_number._M_elems[4] = local_90[4];
      local_90 = local_90 + 5;
      detail::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
                (&local_4c,(detail *)&local_90,ppcVar1);
      std::
      vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
      ::
      emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                  *)&local_78,&local_a8,&local_4c);
      v6_num_nodes = v6_num_nodes + -1;
      ppcVar1 = extraout_RDX_02;
    } while (v6_num_nodes != 0);
  }
  (local_60->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_60->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_60->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          *)local_78.
            super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

std::vector<std::pair<sha1_hash, udp::endpoint>> read_nodes(
		aux::stack_allocator const& alloc
		, int const v4_num_nodes, aux::allocation_slot const v4_nodes_idx
		, int const v6_num_nodes, aux::allocation_slot const v6_nodes_idx)
	{
		aux::vector<std::pair<sha1_hash, udp::endpoint>> nodes;
		nodes.reserve(v4_num_nodes + v6_num_nodes);

		char const* v4_ptr = alloc.ptr(v4_nodes_idx);
		for (int i = 0; i < v4_num_nodes; i++)
		{
			sha1_hash ih;
			std::memcpy(ih.data(), v4_ptr, 20);
			v4_ptr += 20;
			nodes.emplace_back(ih, detail::read_v4_endpoint<udp::endpoint>(v4_ptr));
		}
		char const* v6_ptr = alloc.ptr(v6_nodes_idx);
		for (int i = 0; i < v6_num_nodes; i++)
		{
			sha1_hash ih;
			std::memcpy(ih.data(), v6_ptr, 20);
			v6_ptr += 20;
			nodes.emplace_back(ih, detail::read_v6_endpoint<udp::endpoint>(v6_ptr));
		}

		return std::move(nodes);
	}